

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O1

void __thiscall svg::Text::~Text(Text *this)

{
  pointer pcVar1;
  
  (this->super_Shape).super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Text_0010ed18;
  (this->font).super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Font_0010ecd8;
  pcVar1 = (this->font).family._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->font).family.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->content)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->content).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Text(Point const & origin, std::string const & content, Fill const & fill = Fill(),
             Font const & font = Font(), Stroke const & stroke = Stroke())
            : Shape(fill, stroke), origin(origin), content(content), font(font) { }